

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HashTable.hpp
# Opt level: O1

bool __thiscall
Qentem::
HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
::GetKeyIndex(HashTable<Qentem::String<wchar_t>,_Qentem::HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_>_>
              *this,SizeT *index,Char_T *str,SizeT length)

{
  SizeT hash;
  SizeT *in_RAX;
  HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *pHVar1;
  SizeT *tmp;
  SizeT *local_28;
  
  if (this->index_ == 0) {
    return false;
  }
  local_28 = in_RAX;
  hash = StringUtils::Hash<wchar_t>(str,length);
  pHVar1 = find(this,&local_28,str,length,hash);
  if (pHVar1 != (HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)0x0) {
    *index = *local_28 - 1;
  }
  return pHVar1 != (HAItem_T<Qentem::String<wchar_t>,_Qentem::Value<wchar_t>_> *)0x0;
}

Assistant:

inline bool IsEmpty() const noexcept {
        return (Size() == 0);
    }